

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_backup_finish(sqlite3_backup *p)

{
  sqlite3 *db;
  Pager *pPager;
  int local_30;
  int rc;
  sqlite3 *pSrcDb;
  sqlite3_backup **pp;
  sqlite3_backup *p_local;
  
  if (p == (sqlite3_backup *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    db = p->pSrcDb;
    sqlite3_mutex_enter(db->mutex);
    sqlite3BtreeEnter(p->pSrc);
    if (p->pDestDb != (sqlite3 *)0x0) {
      sqlite3_mutex_enter(p->pDestDb->mutex);
    }
    if (p->pDestDb != (sqlite3 *)0x0) {
      p->pSrc->nBackup = p->pSrc->nBackup + -1;
    }
    if (p->isAttached != 0) {
      pPager = sqlite3BtreePager(p->pSrc);
      for (pSrcDb = (sqlite3 *)sqlite3PagerBackupPtr(pPager); pSrcDb->pVfs != (sqlite3_vfs *)p;
          pSrcDb = (sqlite3 *)&pSrcDb->pVfs->xFullPathname) {
      }
      pSrcDb->pVfs = (sqlite3_vfs *)p->pNext;
    }
    sqlite3BtreeRollback(p->pDest,0,0);
    if (p->rc == 0x65) {
      local_30 = 0;
    }
    else {
      local_30 = p->rc;
    }
    if (p->pDestDb != (sqlite3 *)0x0) {
      sqlite3Error(p->pDestDb,local_30);
      sqlite3LeaveMutexAndCloseZombie(p->pDestDb);
    }
    sqlite3BtreeLeave(p->pSrc);
    if (p->pDestDb != (sqlite3 *)0x0) {
      sqlite3_free(p);
    }
    sqlite3LeaveMutexAndCloseZombie(db);
    p_local._4_4_ = local_30;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_backup_finish(sqlite3_backup *p){
  sqlite3_backup **pp;                 /* Ptr to head of pagers backup list */
  sqlite3 *pSrcDb;                     /* Source database connection */
  int rc;                              /* Value to return */

  /* Enter the mutexes */
  if( p==0 ) return SQLITE_OK;
  pSrcDb = p->pSrcDb;
  sqlite3_mutex_enter(pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  /* Detach this backup from the source pager. */
  if( p->pDestDb ){
    p->pSrc->nBackup--;
  }
  if( p->isAttached ){
    pp = sqlite3PagerBackupPtr(sqlite3BtreePager(p->pSrc));
    assert( pp!=0 );
    while( *pp!=p ){
      pp = &(*pp)->pNext;
      assert( pp!=0 );
    }
    *pp = p->pNext;
  }

  /* If a transaction is still open on the Btree, roll it back. */
  sqlite3BtreeRollback(p->pDest, SQLITE_OK, 0);

  /* Set the error code of the destination database handle. */
  rc = (p->rc==SQLITE_DONE) ? SQLITE_OK : p->rc;
  if( p->pDestDb ){
    sqlite3Error(p->pDestDb, rc);

    /* Exit the mutexes and free the backup context structure. */
    sqlite3LeaveMutexAndCloseZombie(p->pDestDb);
  }
  sqlite3BtreeLeave(p->pSrc);
  if( p->pDestDb ){
    /* EVIDENCE-OF: R-64852-21591 The sqlite3_backup object is created by a
    ** call to sqlite3_backup_init() and is destroyed by a call to
    ** sqlite3_backup_finish(). */
    sqlite3_free(p);
  }
  sqlite3LeaveMutexAndCloseZombie(pSrcDb);
  return rc;
}